

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMD.cpp
# Opt level: O2

void __thiscall OpenMD::RNEMD::RNEMD::collectData(RNEMD *this)

{
  Mat3x3d *this_00;
  int *piVar1;
  Snapshot *this_01;
  pointer ppAVar2;
  pointer ppAVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  int iVar8;
  Molecule *m;
  __normal_iterator<OpenMD::AtomType_**,_std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>_>
  _Var9;
  double *pdVar10;
  ulong uVar11;
  _func_int **pp_Var12;
  uint i;
  ulong uVar13;
  StuntDouble *sd;
  pointer ppCVar14;
  StuntDouble *pSVar15;
  ConstraintPair *pCVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  pointer local_428;
  int local_41c;
  double local_408;
  AtomType *atype;
  double local_3e8;
  undefined8 uStack_3e0;
  RealType local_3d8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  binTypeCounts;
  MoleculeIterator miter;
  Vector3d omega;
  vector<int,_std::allocator<int>_> binEFieldCount;
  Vector3d eField;
  Mat3x3d Ia;
  Vector3d pos;
  shared_ptr<OpenMD::SPFData> spfData;
  vector<int,_std::allocator<int>_> binDOF;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binEField;
  vector<double,_std::allocator<double>_> binMass;
  Vector3d vel;
  vector<int,_std::allocator<int>_> binCount;
  vector<double,_std::allocator<double>_> binKE;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_> binI;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binL;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> binP;
  Vector3d rPos;
  Mat3x3d I;
  vector<double,_std::allocator<double>_> binOmega;
  Vector3d L;
  RealType area;
  vector<double,_std::allocator<double>_> nden;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector3d local_90;
  Vector3d local_78;
  Vector3d local_60;
  Vector3d u;
  
  if (this->doRNEMD_ == true) {
    this_01 = this->info_->sman_->currentSnapshot_;
    this->currentSnap_ = this_01;
    Snapshot::getHmat(&I,this_01);
    this_00 = &this->hmat_;
    RectMatrix<double,_3U,_3U>::operator=
              ((RectMatrix<double,_3U,_3U> *)this_00,(RectMatrix<double,_3U,_3U> *)&I);
    area = getDefaultDividingArea(this);
    Utils::Accumulator<double>::add(&this->areaAccumulator_,&area);
    Vector<double,_3U>::Vector
              (&u.super_Vector<double,_3U>,
               &(this->angularMomentumFluxVector_).super_Vector<double,_3U>);
    Vector<double,_3U>::normalize(&u.super_Vector<double,_3U>);
    if ((this->outputEvaluator_).isDynamic_ == true) {
      SelectionEvaluator::evaluate((SelectionSet *)&I,&this->outputEvaluator_);
      SelectionManager::setSelectionSet(&this->outputSeleMan_,(SelectionSet *)&I);
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&I);
    }
    Vector<double,_3U>::Vector(&vel.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&rPos.super_Vector<double,_3U>);
    Vector<double,_3U>::Vector(&L.super_Vector<double,_3U>);
    SquareMatrix<double,_3>::SquareMatrix(&I.super_SquareMatrix<double,_3>);
    Vector<double,_3U>::Vector(&eField.super_Vector<double,_3U>);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&binMass,(ulong)this->nBins_,(value_type_conflict1 *)&Ia,(allocator_type *)&omega);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&binP,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,(allocator_type *)&Ia);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&binOmega,(ulong)this->nBins_,(value_type_conflict1 *)&Ia,(allocator_type *)&omega);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&binL,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,(allocator_type *)&Ia);
    std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    vector(&binI,(ulong)this->nBins_,(allocator_type *)&Ia);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&binKE,(ulong)this->nBins_,(value_type_conflict1 *)&Ia,(allocator_type *)&omega);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&binEField,(ulong)this->nBins_,(value_type *)OpenMD::V3Zero,(allocator_type *)&Ia);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)((ulong)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                         [0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&binDOF,(ulong)this->nBins_,(value_type_conflict2 *)&Ia,(allocator_type *)&omega);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)((ulong)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                         [0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&binCount,(ulong)this->nBins_,(value_type_conflict2 *)&Ia,(allocator_type *)&omega);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)((ulong)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
                         [0] & 0xffffffff00000000);
    std::vector<int,_std::allocator<int>_>::vector
              (&binEFieldCount,(ulong)this->nBins_,(value_type_conflict2 *)&Ia,
               (allocator_type *)&omega);
    binTypeCounts.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    binTypeCounts.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    binTypeCounts.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize(&binTypeCounts,(ulong)this->nBins_);
      lVar17 = 0;
      for (uVar13 = 0; uVar13 < this->nBins_; uVar13 = uVar13 + 1) {
        Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
             (double)((ulong)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                             [0][0] & 0xffffffff00000000);
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&((binTypeCounts.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar17),
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->outputTypes_).
                         super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict2 *)&Ia)
        ;
        lVar17 = lVar17 + 0x18;
      }
    }
    miter._M_node = (_Base_ptr)0x0;
    Snapshot::getSPFData((Snapshot *)&spfData);
    m = SimInfo::beginMolecule(this->info_,&miter);
    while (m != (Molecule *)0x0) {
      if (m->globalIndex_ !=
          (spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->globalID
         ) {
        local_428 = (m->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        if (local_428 !=
            (m->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_0022bfd9;
        sd = (StuntDouble *)0x0;
        while (sd != (StuntDouble *)0x0) {
          bVar6 = SelectionManager::isSelected(&this->outputSeleMan_,sd);
          if (bVar6) {
            StuntDouble::getPos(&pos,sd);
            Vector<double,_3U>::Vector(&local_c0,&pos.super_Vector<double,_3U>);
            iVar8 = getBin(this,(Vector3d *)&local_c0);
            local_3d8 = (RealType)CONCAT44(local_3d8._4_4_,iVar8);
            dVar19 = sd->mass_;
            StuntDouble::getVel((Vector3d *)&Ia,sd);
            Vector<double,_3U>::operator=(&vel.super_Vector<double,_3U>,(Vector<double,_3U> *)&Ia);
            StuntDouble::getPos(&omega,sd);
            operator-((Vector<double,_3U> *)&Ia,&omega.super_Vector<double,_3U>,
                      &(this->coordinateOrigin_).super_Vector<double,_3U>);
            Vector3<double>::operator=(&rPos,(Vector<double,_3U> *)&Ia);
            local_3e8 = Vector<double,_3U>::lengthSquare(&vel.super_Vector<double,_3U>);
            local_3e8 = dVar19 * 0.5 * local_3e8;
            if (sd->objType_ - otDAtom < 2) {
              StuntDouble::getJ(&omega,sd);
              (*sd->_vptr_StuntDouble[5])((RectMatrix<double,_3U,_3U> *)&Ia,sd);
              if (sd->linear_ == true) {
                uVar11 = (long)(sd->linearAxis_ + 1) % 3 & 0xffffffff;
                uVar13 = (long)(sd->linearAxis_ + 2) % 3 & 0xffffffff;
                dVar20 = omega.super_Vector<double,_3U>.data_[uVar11];
                dVar18 = (dVar20 * dVar20) /
                         *(double *)
                          ((long)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                                 data_ + uVar11 * 0x20);
                dVar20 = omega.super_Vector<double,_3U>.data_[uVar13];
                dVar20 = dVar20 * dVar20;
                pdVar10 = (double *)
                          ((long)Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                                 data_ + uVar13 * 0x20);
                local_41c = 5;
              }
              else {
                auVar21._0_8_ =
                     omega.super_Vector<double,_3U>.data_[0] *
                     omega.super_Vector<double,_3U>.data_[0];
                auVar21._8_8_ =
                     omega.super_Vector<double,_3U>.data_[1] *
                     omega.super_Vector<double,_3U>.data_[1];
                auVar4._8_8_ = Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                               data_[1][1];
                auVar4._0_8_ = Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                               data_[0][0];
                auVar22 = divpd(auVar21,auVar4);
                dVar18 = auVar22._8_8_ + auVar22._0_8_;
                dVar20 = omega.super_Vector<double,_3U>.data_[2] *
                         omega.super_Vector<double,_3U>.data_[2];
                pdVar10 = Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                          + 2;
                local_41c = 6;
              }
              local_3e8 = local_3e8 + (dVar20 / *pdVar10 + dVar18) * 0.5;
            }
            else {
              local_41c = 3;
            }
            cross<double>(&omega,&rPos,&vel);
            operator*((Vector<double,_3U> *)&Ia,dVar19,&omega.super_Vector<double,_3U>);
            Vector3<double>::operator=(&L,(Vector<double,_3U> *)&Ia);
            outProduct<double>((SquareMatrix3<double> *)&nden,&rPos,&rPos);
            operator*((RectMatrix<double,_3U,_3U> *)&omega,(RectMatrix<double,_3U,_3U> *)&nden,
                      dVar19);
            RectMatrix<double,_3U,_3U>::operator=
                      ((RectMatrix<double,_3U,_3U> *)&Ia,(RectMatrix<double,_3U,_3U> *)&omega);
            SquareMatrix3<double>::operator=(&I,(SquareMatrix<double,_3> *)&Ia);
            dVar20 = Vector<double,_3U>::lengthSquare(&rPos.super_Vector<double,_3U>);
            dVar20 = dVar20 * dVar19;
            I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
                 I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
                 dVar20;
            I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] =
                 I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] +
                 dVar20;
            I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] =
                 dVar20 + I.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                          [2];
            uVar13 = (ulong)local_3d8 & 0xffffffff;
            if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0) {
              if (sd->objType_ == otRigidBody) {
                pp_Var12 = (_func_int **)sd[2].mass_;
                if (pp_Var12 != sd[2].properties_._vptr_PropertyMap) goto LAB_0022bb65;
                pSVar15 = (StuntDouble *)0x0;
                while (pSVar15 != (StuntDouble *)0x0) {
                  StuntDouble::getPos(&local_60,pSVar15);
                  uVar7 = getBin(this,&local_60);
                  atype = (AtomType *)pSVar15[1]._vptr_StuntDouble;
                  _Var9 = std::
                          __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                    ((this->outputTypes_).
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start,
                                     (this->outputTypes_).
                                     super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish,&atype);
                  iVar8 = (int)((ulong)((long)_Var9._M_current -
                                       (long)(this->outputTypes_).
                                             super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
                  if (_Var9._M_current ==
                      (this->outputTypes_).
                      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
                    iVar8 = -1;
                  }
                  if (((-1 < (int)uVar7) && (iVar8 != -1)) && ((int)uVar7 < (int)this->nBins_)) {
                    piVar1 = binTypeCounts.
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + iVar8;
                    *piVar1 = *piVar1 + 1;
                  }
                  pp_Var12 = pp_Var12 + 1;
                  pSVar15 = (StuntDouble *)0x0;
                  if (pp_Var12 != sd[2].properties_._vptr_PropertyMap) {
LAB_0022bb65:
                    pSVar15 = (StuntDouble *)*pp_Var12;
                  }
                }
              }
              else if (sd->objType_ < otRigidBody) {
                atype = (AtomType *)sd[1]._vptr_StuntDouble;
                _Var9 = std::
                        __find_if<__gnu_cxx::__normal_iterator<OpenMD::AtomType**,std::vector<OpenMD::AtomType*,std::allocator<OpenMD::AtomType*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::AtomType*const>>
                                  ((this->outputTypes_).
                                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                                   (this->outputTypes_).
                                   super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,&atype);
                iVar8 = (int)((ulong)((long)_Var9._M_current -
                                     (long)(this->outputTypes_).
                                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
                if (_Var9._M_current ==
                    (this->outputTypes_).
                    super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) {
                  iVar8 = -1;
                }
                if (((-1 < local_3d8._0_4_) && (local_3d8._0_4_ < (int)this->nBins_)) &&
                   ((iVar8 != -1 && (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x40) != 0)
                    ))) {
                  piVar1 = binTypeCounts.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar13].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + iVar8;
                  *piVar1 = *piVar1 + 1;
                }
              }
            }
            if ((-1 < local_3d8._0_4_) && (local_3d8._0_4_ < (int)this->nBins_)) {
              binCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar13] =
                   binCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13] + 1;
              binMass.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] =
                   binMass.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13] + dVar19;
              operator*((Vector<double,_3U> *)&Ia,dVar19,&vel.super_Vector<double,_3U>);
              Vector<double,_3U>::add
                        (&binP.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].super_Vector<double,_3U>
                         ,(Vector<double,_3U> *)&Ia);
              binKE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13] =
                   local_3e8 +
                   binKE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13];
              RectMatrix<double,_3U,_3U>::add
                        ((RectMatrix<double,_3U,_3U> *)
                         (binI.
                          super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar13),
                         (RectMatrix<double,_3U,_3U> *)&I);
              Vector<double,_3U>::add
                        (&binL.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar13].super_Vector<double,_3U>
                         ,&L.super_Vector<double,_3U>);
              binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar13] =
                   binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar13] + local_41c;
            }
          }
          if (((this->outputMask_).super__Base_bitset<1UL>._M_w & 0x80) != 0) {
            if (sd->objType_ == otRigidBody) {
              pp_Var12 = (_func_int **)sd[2].mass_;
              if (pp_Var12 != sd[2].properties_._vptr_PropertyMap) goto LAB_0022bbff;
              pSVar15 = (StuntDouble *)0x0;
              while (pSVar15 != (StuntDouble *)0x0) {
                StuntDouble::getPos(&local_78,pSVar15);
                uVar7 = getBin(this,&local_78);
                StuntDouble::getElectricField((Vector3d *)&Ia,pSVar15);
                Vector<double,_3U>::operator=
                          (&eField.super_Vector<double,_3U>,(Vector<double,_3U> *)&Ia);
                if ((-1 < (int)uVar7) && ((int)uVar7 < (int)this->nBins_)) {
                  binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] =
                       binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7] + 1;
                  Vector<double,_3U>::add
                            (&binEField.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar7].
                              super_Vector<double,_3U>,&eField.super_Vector<double,_3U>);
                }
                pp_Var12 = pp_Var12 + 1;
                pSVar15 = (StuntDouble *)0x0;
                if (pp_Var12 != sd[2].properties_._vptr_PropertyMap) {
LAB_0022bbff:
                  pSVar15 = (StuntDouble *)*pp_Var12;
                }
              }
            }
            else {
              StuntDouble::getElectricField((Vector3d *)&Ia,sd);
              Vector<double,_3U>::operator=
                        (&eField.super_Vector<double,_3U>,(Vector<double,_3U> *)&Ia);
              StuntDouble::getPos(&local_90,sd);
              uVar7 = getBin(this,&local_90);
              if ((-1 < (int)uVar7) && ((int)uVar7 < (int)this->nBins_)) {
                binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] =
                     binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7] + 1;
                Vector<double,_3U>::add
                          (&binEField.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar7].
                            super_Vector<double,_3U>,&eField.super_Vector<double,_3U>);
              }
            }
          }
          local_428 = local_428 + 1;
          sd = (StuntDouble *)0x0;
          if (local_428 !=
              (m->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
LAB_0022bfd9:
            sd = *local_428;
          }
        }
        bVar6 = SelectionManager::isSelected(&this->outputSeleMan_,m);
        if (bVar6) {
          ppCVar14 = (m->constraintPairs_).
                     super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (ppCVar14 !=
              (m->constraintPairs_).
              super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_0022c0fc;
          pCVar16 = (ConstraintPair *)0x0;
          while (pCVar16 != (ConstraintPair *)0x0) {
            ConstraintElem::getPos((Vector3d *)&Ia,pCVar16->consElem1_);
            ConstraintElem::getPos(&omega,pCVar16->consElem2_);
            if (this->usePeriodicBoundaryConditions_ == true) {
              Snapshot::wrapVector(this->currentSnap_,(Vector3d *)&Ia);
              Snapshot::wrapVector(this->currentSnap_,&omega);
            }
            OpenMD::operator+(&local_d8,(Vector<double,_3U> *)&Ia,&omega.super_Vector<double,_3U>);
            operator*(&pos.super_Vector<double,_3U>,0.5,&local_d8);
            Vector<double,_3U>::Vector((Vector<double,_3U> *)&nden,&pos.super_Vector<double,_3U>);
            Vector<double,_3U>::Vector(&local_a8,(Vector<double,_3U> *)&nden);
            iVar8 = getBin(this,(Vector3d *)&local_a8);
            binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar8] =
                 binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar8] + -1;
            ppCVar14 = ppCVar14 + 1;
            pCVar16 = (ConstraintPair *)0x0;
            if (ppCVar14 !=
                (m->constraintPairs_).
                super__Vector_base<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0022c0fc:
              pCVar16 = *ppCVar14;
            }
          }
        }
      }
      m = SimInfo::nextMolecule(this->info_,&miter);
    }
    Vector<double,_3U>::Vector(&omega.super_Vector<double,_3U>);
    Ia.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&nden,(long)(this->outputTypes_).
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->outputTypes_).
                           super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3,
               (value_type_conflict1 *)&Ia,(allocator_type *)&pos);
    local_3d8 = Snapshot::getVolume(this->currentSnap_);
    local_408 = 0.0;
    local_3e8 = 0.0;
    uStack_3e0 = 0;
    for (uVar13 = 0; uVar13 < this->nBins_; uVar13 = uVar13 + 1) {
      dVar19 = (double)(uVar13 & 0xffffffff) + 0.5;
      if (this->usePeriodicBoundaryConditions_ == true) {
        (**(code **)(**(long **)(*(long *)&(((this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->accumulator
                                           ).
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x10))
                  ((dVar19 / (double)this->nBins_) *
                   *(double *)
                    ((long)(this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>
                           .data_ + (ulong)this->rnemdPrivilegedAxis_ * 0x20));
        auVar23._8_8_ =
             *(undefined8 *)
              ((long)(this_00->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
              + (ulong)this->rnemdPrivilegedAxis_ * 0x20);
        auVar23._0_8_ = local_3d8;
        auVar5._8_8_ = (double)this->nBins_;
        auVar5._0_8_ = (double)this->nBins_;
        auVar22 = divpd(auVar23,auVar5);
      }
      else {
        (**(code **)(**(long **)(*(long *)&(this->data_).
                                           super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                           ._M_impl.super__Vector_impl_data._M_start[1].accumulator.
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x10))
                  (dVar19 * this->binWidth_);
        dVar19 = this->binWidth_;
        dVar20 = pow((double)((int)uVar13 + 1) * dVar19,3.0);
        dVar19 = pow((double)(uVar13 & 0xffffffff) * dVar19,3.0);
        auVar22._0_8_ = ((dVar20 - dVar19) * 12.566370614359172) / 3.0;
        auVar22._8_8_ = local_408;
      }
      uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
      if (((char)uVar11 < '\0') &&
         (0 < binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13])) {
        operator/((Vector<double,_3U> *)&Ia,
                  &binEField.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar13].super_Vector<double,_3U>,
                  (double)binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar13]);
        Vector3<double>::operator=(&eField,(Vector<double,_3U> *)&Ia);
        (**(code **)(**(long **)(*(long *)&(this->data_).
                                           super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                           ._M_impl.super__Vector_impl_data._M_start[7].accumulator.
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x20))()
        ;
        uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
      }
      local_408 = auVar22._8_8_;
      if (((((uint)uVar11 >> 8 & 1) != 0) && (this->usePeriodicBoundaryConditions_ == true)) &&
         (0 < binEFieldCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar13])) {
        local_3e8 = local_3e8 +
                    eField.super_Vector<double,_3U>.data_[this->rnemdPrivilegedAxis_] * local_408;
        (**(code **)(**(long **)(*(long *)&(this->data_).
                                           super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                           ._M_impl.super__Vector_impl_data._M_start[8].accumulator.
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x10))()
        ;
        uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar11 & 0x20) != 0) {
        (**(code **)(**(long **)(*(long *)&(this->data_).
                                           super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                           ._M_impl.super__Vector_impl_data._M_start[5].accumulator.
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x10))
                  ((binMass.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar13] * 1.66053886) / auVar22._0_8_);
        uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
      }
      if ((uVar11 & 0x40) != 0) {
        ppAVar2 = (this->outputTypes_).
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        ppAVar3 = (this->outputTypes_).
                  super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        for (uVar7 = 0; uVar11 = (ulong)uVar7, uVar11 < (ulong)((long)ppAVar2 - (long)ppAVar3 >> 3);
            uVar7 = uVar7 + 1) {
          nden.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar11] =
               ((double)binTypeCounts.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar13].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar11] / auVar22._0_8_) * 1660.5390404272;
        }
        (**(code **)(**(long **)(*(long *)&(this->data_).
                                           super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                           ._M_impl.super__Vector_impl_data._M_start[6].accumulator.
                                           super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                           ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x18))()
        ;
      }
      if (0 < binCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[uVar13]) {
        uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        if ((uVar11 & 8) != 0) {
          operator/((Vector<double,_3U> *)&Ia,
                    &binP.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].super_Vector<double,_3U>,
                    binMass.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar13]);
          Vector3<double>::operator=(&vel,(Vector<double,_3U> *)&Ia);
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[3].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x20))
                    ();
          uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        if ((uVar11 & 0x10) != 0) {
          SquareMatrix3<double>::inverse
                    ((SquareMatrix3<double> *)&Ia,
                     binI.
                     super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar13);
          operator*(&pos.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&Ia,
                    &binL.
                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].super_Vector<double,_3U>);
          Vector3<double>::operator=(&omega,&pos.super_Vector<double,_3U>);
          (**(code **)(**(long **)(*(long *)&(this->data_).
                                             super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                             ._M_impl.super__Vector_impl_data._M_start[4].
                                             accumulator.
                                             super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                             ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x20))
                    ();
          uVar11 = (this->outputMask_).super__Base_bitset<1UL>._M_w;
        }
        if ((uVar11 & 4) != 0) {
          if (binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start[uVar13] < 1) {
            std::operator<<((ostream *)&std::cerr,"No degrees of freedom in this bin?\n");
          }
          else {
            (**(code **)(**(long **)(*(long *)&(this->data_).
                                               super__Vector_base<OpenMD::RNEMD::RNEMD::OutputData,_std::allocator<OpenMD::RNEMD::RNEMD::OutputData>_>
                                               ._M_impl.super__Vector_impl_data._M_start[2].
                                               accumulator.
                                               super__Vector_base<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>,_std::allocator<std::unique_ptr<OpenMD::Utils::BaseAccumulator,_std::default_delete<OpenMD::Utils::BaseAccumulator>_>_>_>
                                               ._M_impl.super__Vector_impl_data + uVar13 * 8) + 0x10
                        ))((binKE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar13] +
                           binKE.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar13]) /
                           ((double)binDOF.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar13] * 0.0019872156 *
                           0.0004184));
          }
        }
      }
    }
    this->hasData_ = true;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&nden.super__Vector_base<double,_std::allocator<double>_>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spfData.super___shared_ptr<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&binTypeCounts);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&binEFieldCount.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&binCount.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&binDOF.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&binEField.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&binKE.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
    ~_Vector_base(&binI.
                   super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                 );
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&binL.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&binOmega.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&binP.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&binMass.super__Vector_base<double,_std::allocator<double>_>);
  }
  return;
}

Assistant:

void RNEMD::collectData() {
    if (!doRNEMD_) return;
    currentSnap_ = info_->getSnapshotManager()->getCurrentSnapshot();
    hmat_        = currentSnap_->getHmat();

    // collectData() can be called more frequently than the doRNEMD(), so use
    // the computed area from the last exchange time:
    RealType area = getDefaultDividingArea();
    areaAccumulator_.add(area);

    Vector3d u = angularMomentumFluxVector_;
    u.normalize();

    // throw an error if isDynamic instead?
    if (outputEvaluator_.isDynamic()) {
      outputSeleMan_.setSelectionSet(outputEvaluator_.evaluate());
    }

    int binNo {};
    int typeIndex(-1);
    RealType mass {};
    Vector3d vel {};
    Vector3d rPos {};
    RealType KE {};
    Vector3d L {};
    Mat3x3d I {};
    RealType r2 {};
    Vector3d eField {};
    int DOF {};

    vector<RealType> binMass(nBins_, 0.0);
    vector<Vector3d> binP(nBins_, V3Zero);
    vector<RealType> binOmega(nBins_, 0.0);
    vector<Vector3d> binL(nBins_, V3Zero);
    vector<Mat3x3d> binI(nBins_);
    vector<RealType> binKE(nBins_, 0.0);
    vector<Vector3d> binEField(nBins_, V3Zero);
    vector<int> binDOF(nBins_, 0);
    vector<int> binCount(nBins_, 0);
    vector<int> binEFieldCount(nBins_, 0);
    vector<vector<int>> binTypeCounts;

    if (outputMask_[ACTIVITY]) {
      binTypeCounts.resize(nBins_);
      for (unsigned int i = 0; i < nBins_; i++) {
        binTypeCounts[i].resize(outputTypes_.size(), 0);
      }
    }

    SimInfo::MoleculeIterator miter;
    std::vector<StuntDouble*>::iterator iiter;
    std::vector<AtomType*>::iterator at;
    Molecule* mol;
    StuntDouble* sd;
    AtomType* atype;
    ConstraintPair* consPair;
    Molecule::ConstraintPairIterator cpi;

    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      if (mol->getGlobalIndex() == spfData->globalID) { continue; }

      for (sd = mol->beginIntegrableObject(iiter); sd != NULL;
           sd = mol->nextIntegrableObject(iiter)) {
        if (outputSeleMan_.isSelected(sd)) {
          Vector3d pos = sd->getPos();
          binNo        = getBin(pos);

          mass = sd->getMass();
          vel  = sd->getVel();
          rPos = sd->getPos() - coordinateOrigin_;
          KE   = 0.5 * mass * vel.lengthSquare();
          DOF  = 3;

          if (sd->isDirectional()) {
            Vector3d angMom = sd->getJ();
            Mat3x3d Ia      = sd->getI();
            if (sd->isLinear()) {
              int i = sd->linearAxis();
              int j = (i + 1) % 3;
              int k = (i + 2) % 3;
              KE += 0.5 * (angMom[j] * angMom[j] / Ia(j, j) +
                           angMom[k] * angMom[k] / Ia(k, k));
              DOF += 2;
            } else {
              KE += 0.5 * (angMom[0] * angMom[0] / Ia(0, 0) +
                           angMom[1] * angMom[1] / Ia(1, 1) +
                           angMom[2] * angMom[2] / Ia(2, 2));
              DOF += 3;
            }
          }

          L  = mass * cross(rPos, vel);
          I  = outProduct(rPos, rPos) * mass;
          r2 = rPos.lengthSquare();
          I(0, 0) += mass * r2;
          I(1, 1) += mass * r2;
          I(2, 2) += mass * r2;

          if (outputMask_[ACTIVITY]) {
            if (sd->isRigidBody()) {
              int atomBinNo;
              RigidBody* rb = static_cast<RigidBody*>(sd);
              std::vector<Atom*>::iterator ai;
              Atom* atom;
              for (atom = rb->beginAtom(ai); atom != NULL;
                   atom = rb->nextAtom(ai)) {
                typeIndex = -1;
                atomBinNo = getBin(atom->getPos());

                atype = static_cast<Atom*>(atom)->getAtomType();
                at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
                if (at != outputTypes_.end()) {
                  typeIndex = std::distance(outputTypes_.begin(), at);
                }

                if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                  if (typeIndex != -1) binTypeCounts[atomBinNo][typeIndex]++;
                }
              }
            } else if (sd->isAtom()) {
              typeIndex = -1;
              atype     = static_cast<Atom*>(sd)->getAtomType();
              at = std::find(outputTypes_.begin(), outputTypes_.end(), atype);
              if (at != outputTypes_.end()) {
                typeIndex = std::distance(outputTypes_.begin(), at);
              }

              if (binNo >= 0 && binNo < int(nBins_)) {
                if (outputMask_[ACTIVITY] && typeIndex != -1)
                  binTypeCounts[binNo][typeIndex]++;
              }
            }
          }

          if (binNo >= 0 && binNo < int(nBins_)) {
            binCount[binNo]++;
            binMass[binNo] += mass;
            binP[binNo] += mass * vel;
            binKE[binNo] += KE;
            binI[binNo] += I;
            binL[binNo] += L;
            binDOF[binNo] += DOF;
          }
        }

        // Calculate the electric field (kcal/mol/e/Angstrom) for all atoms
        // in the box
        if (outputMask_[ELECTRICFIELD]) {
          int atomBinNo;
          if (sd->isRigidBody()) {
            RigidBody* rb = static_cast<RigidBody*>(sd);
            std::vector<Atom*>::iterator ai;
            Atom* atom;
            for (atom = rb->beginAtom(ai); atom != NULL;
                 atom = rb->nextAtom(ai)) {
              atomBinNo = getBin(atom->getPos());
              eField    = atom->getElectricField();

              if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
                binEFieldCount[atomBinNo]++;
                binEField[atomBinNo] += eField;
              }
            }
          } else {
            eField    = sd->getElectricField();
            atomBinNo = getBin(sd->getPos());

            if (atomBinNo >= 0 && atomBinNo < int(nBins_)) {
              binEFieldCount[atomBinNo]++;
              binEField[atomBinNo] += eField;
            }
          }
        }
      }

      // we need to subtract out degrees of freedom from constraints
      // belonging in this bin:
      if (outputSeleMan_.isSelected(mol)) {
        for (consPair = mol->beginConstraintPair(cpi); consPair != NULL;
             consPair = mol->nextConstraintPair(cpi)) {
          Vector3d posA = consPair->getConsElem1()->getPos();
          Vector3d posB = consPair->getConsElem2()->getPos();

          if (usePeriodicBoundaryConditions_) {
            currentSnap_->wrapVector(posA);
            currentSnap_->wrapVector(posB);
          }

          Vector3d coc = 0.5 * (posA + posB);
          int binCons  = getBin(coc);
          binDOF[binCons] -= 1;
        }
      }
    }

#ifdef IS_MPI
    for (unsigned int i = 0; i < nBins_; i++) {
      MPI_Allreduce(MPI_IN_PLACE, &binCount[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binMass[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binP[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binL[i].getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, binI[i].getArrayPointer(), 9, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binKE[i], 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, &binDOF[i], 1, MPI_INT, MPI_SUM,
                    MPI_COMM_WORLD);

      if (outputMask_[ELECTRICFIELD]) {
        MPI_Allreduce(MPI_IN_PLACE, &binEFieldCount[i], 1, MPI_INT, MPI_SUM,
                      MPI_COMM_WORLD);
        MPI_Allreduce(MPI_IN_PLACE, binEField[i].getArrayPointer(), 3,
                      MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      }
      if (outputMask_[ACTIVITY]) {
        MPI_Allreduce(MPI_IN_PLACE, &binTypeCounts[i][0], outputTypes_.size(),
                      MPI_INT, MPI_SUM, MPI_COMM_WORLD);
      }
    }
#endif

    Vector3d omega;
    RealType z, r, temp, binVolume, den(0.0), dz(0.0);
    std::vector<RealType> nden(outputTypes_.size(), 0.0);
    RealType boxVolume = currentSnap_->getVolume();
    RealType ePot(0.0);

    for (unsigned int i = 0; i < nBins_; i++) {
      if (usePeriodicBoundaryConditions_) {
        z = (((RealType)i + 0.5) / (RealType)nBins_) *
            hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_);
        data_[Z].accumulator[i]->add(z);

        binVolume = boxVolume / nBins_;
        dz        = hmat_(rnemdPrivilegedAxis_, rnemdPrivilegedAxis_) /
             (RealType)nBins_;
      } else {
        r = (((RealType)i + 0.5) * binWidth_);
        data_[R].accumulator[i]->add(r);

        RealType rinner = (RealType)i * binWidth_;
        RealType router = (RealType)(i + 1) * binWidth_;
        binVolume =
            (4.0 * Constants::PI * (pow(router, 3) - pow(rinner, 3))) / 3.0;
      }

      // The calculations of the following properties are done regardless
      //   of whether or not the selected species are present in the bin
      if (outputMask_[ELECTRICFIELD] && binEFieldCount[i] > 0) {
        eField = binEField[i] / RealType(binEFieldCount[i]);
        data_[ELECTRICFIELD].accumulator[i]->add(eField);
      }

      if (outputMask_[ELECTROSTATICPOTENTIAL]) {
        if (usePeriodicBoundaryConditions_ && binEFieldCount[i] > 0) {
          ePot += eField[rnemdPrivilegedAxis_] * dz;
          data_[ELECTROSTATICPOTENTIAL].accumulator[i]->add(ePot);
        }
      }

      // For the following properties, zero should be added if the selected
      //   species is not present in the bin
      if (outputMask_[DENSITY]) {
        den = binMass[i] * Constants::densityConvert / binVolume;
        data_[DENSITY].accumulator[i]->add(den);
      }

      if (outputMask_[ACTIVITY]) {
        for (unsigned int j = 0; j < outputTypes_.size(); j++) {
          nden[j] = (binTypeCounts[i][j] / binVolume) *
                    Constants::concentrationConvert;
        }
        data_[ACTIVITY].accumulator[i]->add(nden);
      }

      if (binCount[i] > 0) {
        // The calculations of the following properties are meaningless if
        //   the selected species is not found in the bin
        if (outputMask_[VELOCITY]) {
          vel = binP[i] / binMass[i];
          data_[VELOCITY].accumulator[i]->add(vel);
        }

        if (outputMask_[ANGULARVELOCITY]) {
          omega = binI[i].inverse() * binL[i];
          data_[ANGULARVELOCITY].accumulator[i]->add(omega);
        }

        if (outputMask_[TEMPERATURE]) {
          if (binDOF[i] > 0) {
            temp = 2.0 * binKE[i] /
                   (binDOF[i] * Constants::kb * Constants::energyConvert);
            data_[TEMPERATURE].accumulator[i]->add(temp);
          } else {
            std::cerr << "No degrees of freedom in this bin?\n";
          }
        }
      }
    }

    hasData_ = true;
  }